

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O2

bool glcts::checkResults<int>
               (Context *context,GLuint copy_po_id,GLuint id,GLuint width,GLuint height,GLuint depth
               ,GLuint components,GLenum format,GLenum type,STORAGE_TYPE storType,int *expectedData)

{
  ostringstream *this;
  GLboolean GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  undefined **value;
  ulong uVar8;
  bool bVar9;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 uVar10;
  GLuint uint_tex_id;
  GLuint local_1e8;
  GLint old_program;
  ulong local_1e0;
  Context *local_1d8;
  ulong local_1d0;
  vector<int,_std::allocator<int>_> resultData;
  undefined1 local_1b0 [384];
  long lVar4;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_1e8 = id;
  local_1d8 = context;
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1d0 = (ulong)(height * width * components);
  std::vector<int,_std::allocator<int>_>::vector(&resultData,local_1d0,(allocator_type *)local_1b0);
  old_program = 0;
  uint_tex_id = 0;
  if (type == 0x1406) {
    (**(code **)(lVar4 + 0x6f8))(1,&uint_tex_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error generating temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x9d);
    (**(code **)(lVar4 + 0xb8))(0xde1,uint_tex_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error binding temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa1);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8d70,width,height);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error allocating temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa3);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error setting texture object\'s filter mode!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa7);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2600);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error setting texture object\'s filter mode!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa9);
    (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,uint_tex_id,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error attaching texture to frame buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xad);
    (**(code **)(lVar4 + 0x80))(1,uint_tex_id,0,0,0,0x88b9,CONCAT44(uVar10,0x8d70));
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error binding integer texture for copy destination",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb1);
    (**(code **)(lVar4 + 0x868))(0x8b8d,&old_program);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error querying old program!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb5);
    (**(code **)(lVar4 + 0x1680))(copy_po_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb7);
  }
  uVar6 = 0;
  uVar8 = 0;
  local_1e0 = (ulong)depth;
  do {
    if (local_1e0 == uVar8) {
LAB_00d3d04b:
      if (type == 0x1406) {
        (**(code **)(lVar4 + 0x1680))(old_program);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Error setting active program object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                        ,0xed);
        (**(code **)(lVar4 + 0x480))(1,&uint_tex_id);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Error deleting temporary texture!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                        ,0xf1);
      }
      bVar9 = local_1e0 <= uVar8;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&resultData.super__Vector_base<int,_std::allocator<int>_>);
      return bVar9;
    }
    if (type == 0x1406) {
      (**(code **)(lVar4 + 0x80))(0,local_1e8,0,0,uVar8 & 0xffffffff,35000,0x8814);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error binding floating point texture for copy source",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xc3);
      (**(code **)(lVar4 + 0x528))(width,height,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error dispatching float-to-integer compute shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xc5);
      (**(code **)(lVar4 + 0x1220))
                (0,0,width,height,0x8d99,0x1405,
                 resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      iVar2 = 0xc9;
    }
    else {
      (**(code **)(lVar4 + 0x6b8))(0x8ca8,0x8ce0,local_1e8,0,uVar8 & 0xffffffff);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error attaching texture to frame buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xcf);
      (**(code **)(lVar4 + 0x1220))
                (0,0,width,height,format,type,
                 resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      iVar2 = 0xd3;
    }
    glu::checkError(dVar3,"Error reading pixels from frame buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,iVar2);
    GVar1 = areBuffersEqual<int>
                      (resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,expectedData + uVar6,(GLuint)local_1d0);
    if (GVar1 == '\0') {
      local_1b0._0_8_ = local_1d8->m_testCtx->m_log;
      this = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,"Wrong value in result texture for ");
      pcVar5 = "uimageCubeArray";
      if (type == 0x1404) {
        pcVar5 = "iimageCubeArray";
      }
      pcVar7 = "imageCubeArray";
      if (type != 0x1406) {
        pcVar7 = pcVar5;
      }
      std::operator<<((ostream *)this,pcVar7);
      std::operator<<((ostream *)this," for resolution[w,h,d] = [");
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::operator<<((ostream *)this,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::operator<<((ostream *)this,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::operator<<((ostream *)this,"] for layer[");
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::operator<<((ostream *)this,"] and ");
      value = &TextureCubeMapArrayImageOpCompute::m_immutable_storage;
      if (storType == ST_MUTABLE) {
        value = (undefined **)&TextureCubeMapArrayImageOpCompute::m_mutable_storage;
      }
      this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " storage!");
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      goto LAB_00d3d04b;
    }
    uVar8 = uVar8 + 1;
    uVar6 = uVar6 + components * height * width;
  } while( true );
}

Assistant:

bool checkResults(Context& context, glw::GLuint copy_po_id, glw::GLuint id, glw::GLuint width, glw::GLuint height,
				  glw::GLuint depth, glw::GLuint components, glw::GLenum format, glw::GLenum type,
				  STORAGE_TYPE storType, T* expectedData)
{
	/* Get GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* prepare buffers for result data */
	std::vector<T> resultData(width * height * components);

	glw::GLint  old_program = 0;
	glw::GLuint uint_tex_id = 0;

	/* Floating point textures are not renderable, so we will need to copy their bits to a temporary unsigned integer texture */
	if (type == GL_FLOAT)
	{
		/* Generate a new texture name */
		gl.genTextures(1, &uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating temporary texture object!");

		/* Allocate unsigned integer storage */
		gl.bindTexture(GL_TEXTURE_2D, uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding temporary texture object!");
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32UI, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating temporary texture object!");

		/* Set the filter mode */
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

		/* Attach it to the framebuffer */
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, uint_tex_id, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

		/* And bind it to an image unit for writing */
		gl.bindImageTexture(1, uint_tex_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding integer texture for copy destination");

		/* Finally, bind the copy compute shader */
		gl.getIntegerv(GL_CURRENT_PROGRAM, &old_program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error querying old program!");
		gl.useProgram(copy_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");
	}

	bool result = true;

	for (glw::GLuint i = 0; i < depth; ++i)
	{
		/* Floating point textures are not renderable */
		if (type == GL_FLOAT)
		{
			/* Use a compute shader to store the float bits as unsigned integers */
			gl.bindImageTexture(0, id, 0, GL_FALSE, i, GL_READ_ONLY, GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding floating point texture for copy source");
			gl.dispatchCompute(width, height, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error dispatching float-to-integer compute shader");

			/* Read data as unsigned ints */
			gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &resultData[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from frame buffer!");
		}
		else
		{
			/* Attach proper 2D texture to frame buffer and read pixels */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, id, 0, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

			/* Read data */
			gl.readPixels(0, 0, width, height, format, type, &resultData[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from frame buffer!");
		}

		/* Prepare correct pointer for expected data layer */
		T* pointer = &expectedData[0] + (i * width * height * components);

		/* If compared data are not equal log error and return false */
		if (!areBuffersEqual<T>(&resultData[0], pointer, width * height * components))
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong value in result texture for "
				<< ((type == GL_FLOAT) ? "imageCubeArray" : ((type == GL_INT) ? "iimageCubeArray" : "uimageCubeArray"))
				<< " for resolution[w,h,d] = [" << width << "," << height << "," << depth << "] for layer[" << i
				<< "] and " << ((storType == ST_MUTABLE) ? TextureCubeMapArrayImageOpCompute::m_mutable_storage :
														   TextureCubeMapArrayImageOpCompute::m_immutable_storage)
				<< " storage!" << tcu::TestLog::EndMessage;
			result = false;
			break;
		}
	}

	/* Clean up the floating point stuff */
	if (type == GL_FLOAT)
	{
		/* Restore the program */
		gl.useProgram(old_program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

		/* Delete the temporary texture */
		gl.deleteTextures(1, &uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error deleting temporary texture!");
	}

	return result;
}